

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::forwardDilation_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t _elemsize;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  Layer *pLVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  int j;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  void *pvVar18;
  int _w;
  ulong uVar19;
  long lVar20;
  int _w_00;
  int iVar21;
  int _w_01;
  ulong uVar22;
  undefined4 *puVar23;
  int iVar24;
  void *pvVar25;
  ulong uVar26;
  undefined4 *puVar27;
  int j_1;
  long lVar28;
  ulong uVar29;
  undefined4 *puVar30;
  long local_1c8;
  long local_1c0;
  long local_180;
  long local_160;
  Mat local_118;
  Mat local_c8;
  Option opt_g;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  iVar3 = (this->super_Convolution).kernel_w;
  iVar4 = (this->super_Convolution).stride_w;
  uVar5 = (this->super_Convolution).dilation_w;
  iVar21 = (iVar3 + -1) * uVar5 + 1;
  iVar11 = (iVar1 - iVar21) / iVar4;
  _w_00 = iVar11 + 1;
  Mat::create(top_blob,_w_00,(iVar2 - iVar21) / iVar4 + 1,(this->super_Convolution).num_output,
              _elemsize,opt->blob_allocator);
  iVar21 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_118.cstep = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    uVar17 = 0;
    if (0 < (int)uVar5) {
      uVar17 = (ulong)uVar5;
    }
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    local_1c0 = 0;
    local_1c8 = 0;
    for (uVar16 = 0; uVar16 != uVar17; uVar16 = uVar16 + 1) {
      local_180 = local_1c0;
      local_160 = local_1c8;
      for (uVar15 = 0; uVar15 != uVar5; uVar15 = uVar15 + 1) {
        uVar19 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar15) / (long)(int)uVar5;
        uVar29 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar16) / (long)(int)uVar5;
        _w = (int)uVar19;
        iVar21 = (_w - iVar3) / iVar4;
        iVar24 = (int)uVar29;
        iVar12 = (iVar24 - iVar3) / iVar4;
        Mat::create(&local_c8,_w,iVar24,bottom_blob->c,_elemsize,opt->workspace_allocator);
        if ((local_c8.data == (void *)0x0) || ((long)local_c8.c * local_c8.cstep == 0)) {
LAB_0018fbd6:
          iVar21 = -100;
          goto LAB_0018fbd9;
        }
        _w_01 = iVar21 + 1;
        Mat::create(&local_118,_w_01,iVar12 + 1,(this->super_Convolution).num_output,_elemsize,
                    opt->workspace_allocator);
        if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0))
        goto LAB_0018fbd6;
        uVar19 = uVar19 & 0xffffffff;
        if (_w < 1) {
          uVar19 = 0;
        }
        uVar29 = uVar29 & 0xffffffff;
        if (iVar24 < 1) {
          uVar29 = 0;
        }
        uVar6 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar6 = 0;
        }
        pvVar18 = local_c8.data;
        for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
          sVar7 = bottom_blob->cstep;
          pvVar8 = bottom_blob->data;
          sVar9 = bottom_blob->elemsize;
          iVar24 = 0;
          pvVar25 = pvVar18;
          for (uVar26 = 0; uVar26 != uVar29; uVar26 = uVar26 + 1) {
            puVar23 = (undefined4 *)
                      ((long)pvVar8 + (long)iVar24 * 4 + sVar7 * sVar9 * uVar22 + local_160);
            for (uVar14 = 0; uVar19 != uVar14; uVar14 = uVar14 + 1) {
              *(undefined4 *)((long)pvVar25 + uVar14 * 4) = *puVar23;
              puVar23 = puVar23 + (int)uVar5;
            }
            pvVar25 = (void *)((long)pvVar25 + (long)_w * 4);
            iVar24 = iVar24 + uVar5 * iVar1;
          }
          pvVar18 = (void *)((long)pvVar18 +
                            local_c8.cstep *
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        }
        opt_g.lightmode = opt->lightmode;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_ops = opt->use_subgroup_ops;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.vulkan_device_index = opt->vulkan_device_index;
        opt_g.use_reserved_1 = opt->use_reserved_1;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_2 = opt->use_reserved_2;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_fp16_uniform = opt->use_fp16_uniform;
        opt_g.use_int8_uniform = opt->use_int8_uniform;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = local_118.allocator;
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&local_c8,&local_118,&opt_g);
        uVar6 = (this->super_Convolution).num_output;
        sVar7 = top_blob->cstep;
        uVar19 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar19 = 0;
        }
        puVar23 = (undefined4 *)((long)top_blob->data + local_180);
        sVar9 = top_blob->elemsize;
        for (uVar29 = 0; uVar29 != uVar19; uVar29 = uVar29 + 1) {
          pvVar18 = (void *)(local_118.cstep *
                             CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) *
                             uVar29 + (long)local_118.data);
          puVar27 = puVar23;
          for (lVar20 = 0; lVar20 <= iVar12; lVar20 = lVar20 + 1) {
            puVar30 = puVar27;
            for (lVar28 = 0; lVar28 <= iVar21; lVar28 = lVar28 + 1) {
              *puVar30 = *(undefined4 *)((long)pvVar18 + lVar28 * 4);
              puVar30 = puVar30 + (int)uVar5;
            }
            pvVar18 = (void *)((long)pvVar18 + (long)_w_01 * 4);
            puVar27 = puVar27 + (int)(_w_00 * uVar5);
          }
          puVar23 = (undefined4 *)((long)puVar23 + sVar7 * sVar9);
        }
        local_160 = local_160 + 4;
        local_180 = local_180 + 4;
      }
      local_1c8 = local_1c8 + (long)iVar1 * 4;
      local_1c0 = local_1c0 + (long)iVar11 * 4 + 4;
    }
    pLVar10 = this->activation;
    iVar21 = 0;
    if (pLVar10 != (Layer *)0x0) {
      (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
      iVar21 = 0;
    }
LAB_0018fbd9:
    piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar13 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar21;
}

Assistant:

int Convolution_x86_avx512::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}